

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

int Bbl_ManSaveSop(Bbl_Man_t *p,char *pSop,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pSop_00;
  int *piVar5;
  int nWords;
  int Length;
  int iFunc;
  char *pSopNew;
  Bbl_Fnc_t *pFnc;
  int nVars_local;
  char *pSop_local;
  Bbl_Man_t *p_local;
  
  sVar4 = strlen(pSop);
  iVar1 = (int)sVar4 + 1;
  iVar2 = iVar1 / 4 + (uint)(0 < iVar1 % 4);
  pSop_00 = Bbl_ManSortSop(pSop,nVars);
  iVar3 = Vec_StrSize(p->pFncs);
  iVar1 = Bbl_ManSopCheckUnique(p,pSop_00,nVars,iVar1 / (nVars + 3),iVar3);
  iVar3 = Vec_StrSize(p->pFncs);
  if (iVar1 == iVar3) {
    piVar5 = (int *)Vec_StrFetch(p->pFncs,iVar2 * 4 + 4);
    piVar5[(long)(iVar2 + -1) + 1] = 0;
    *piVar5 = iVar2;
    strcpy((char *)(piVar5 + 1),pSop_00);
    if ((long)iVar1 != (long)piVar5 - (long)p->pFncs->pArray) {
      __assert_fail("iFunc == (char *)pFnc - p->pFncs->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/bbl/bblif.c"
                    ,0x3cb,"int Bbl_ManSaveSop(Bbl_Man_t *, char *, int)");
    }
  }
  if (pSop_00 != (char *)0x0) {
    free(pSop_00);
  }
  return iVar1;
}

Assistant:

int Bbl_ManSaveSop( Bbl_Man_t * p, char * pSop, int nVars )
{
    Bbl_Fnc_t * pFnc;
    char * pSopNew;
    int iFunc, Length = strlen(pSop) + 1;
    int nWords = Length / 4 + (Length % 4 > 0);
    // reorder cubes to semi-canicize SOPs
    pSopNew = Bbl_ManSortSop( pSop, nVars );
    // get the candidate location
    iFunc = Bbl_ManSopCheckUnique( p, pSopNew, nVars, Length / (nVars + 3), Vec_StrSize(p->pFncs) );
//    iFunc = Vec_StrSize(p->pFncs);
    if ( iFunc == Vec_StrSize(p->pFncs) )
    { // store this SOP
        pFnc = (Bbl_Fnc_t *)Vec_StrFetch( p->pFncs, sizeof(Bbl_Fnc_t) + nWords * sizeof(int) );
        pFnc->pWords[nWords-1] = 0;
        pFnc->nWords = nWords;
        strcpy( (char *)pFnc->pWords, pSopNew );
        assert( iFunc == (char *)pFnc - p->pFncs->pArray );
    }
    BBLIF_FREE( pSopNew );
    return iFunc;
}